

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O0

void __thiscall
BuildsMetaMakefileGenerator::~BuildsMetaMakefileGenerator(BuildsMetaMakefileGenerator *this)

{
  BuildsMetaMakefileGenerator *in_RDI;
  
  ~BuildsMetaMakefileGenerator(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

~BuildsMetaMakefileGenerator() { clearBuilds(); }